

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O0

void __thiscall
nrg::detail::AsyncQueue<nrg::InstantExecution>::run(AsyncQueue<nrg::InstantExecution> *this)

{
  bool bVar1;
  QueueElement *__x;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60 [2];
  ExceptionType *ex;
  QueueElement elem;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  AsyncQueue<nrg::InstantExecution> *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->guard_);
  while( true ) {
    while (bVar1 = InstantExecution::isEmpty(&this->queue_), ((bVar1 ^ 0xffU) & 1) != 0) {
      __x = InstantExecution::top(&this->queue_);
      std::function<void_()>::function((function<void_()> *)&ex,__x);
      bVar1 = InstantExecution::isDue((function<void_()> *)&ex);
      if (bVar1) {
        InstantExecution::pop(&this->queue_);
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
        InstantExecution::execute((QueueElement *)&ex);
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_20);
      }
      else {
        local_60[0].__r = (rep)InstantExecution::whenIsDue((QueueElement *)&ex);
        std::condition_variable::
        wait_for<long,std::ratio<1l,1000000000l>,nrg::detail::AsyncQueue<nrg::InstantExecution>::run()::_lambda()_1_>
                  (&this->cond_,(unique_lock<std::mutex> *)local_20,local_60,
                   (anon_class_8_1_8991fb9c)this);
      }
      std::function<void_()>::~function((function<void_()> *)&ex);
    }
    if ((this->running_ & 1U) == 0) break;
    std::condition_variable::wait((unique_lock *)&this->cond_);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void run()
    {
        std::unique_lock<std::mutex> lock(guard_);
        while (true) {
            while (!AsyncStyle::isEmpty(queue_)) {
                typename AsyncStyle::QueueElement elem = std::move(AsyncStyle::top(queue_));
                if (AsyncStyle::isDue(elem)) {
                    AsyncStyle::pop(queue_);

                    lock.unlock();
                    try {
                        AsyncStyle::execute(elem);
                    }
                    catch(typename AsyncStyle::ExceptionType& ex) {
                        onError_(ex);
                    }
                    lock.lock();
                } else {
                    cond_.wait_for(lock, AsyncStyle::whenIsDue(elem),
                        [this](){ return AsyncStyle::isDue(AsyncStyle::top(queue_)); });
                }
            }
            if (!running_) {
                break;
            }
            cond_.wait(lock);
        }
    }